

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O2

void __thiscall
spvtools::opt::RegisterLiveness::SimulateFission
          (RegisterLiveness *this,Loop *loop,
          unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          *moved_inst,
          unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          *copied_inst,RegionRegisterLiveness *l1_sim_result,RegionRegisterLiveness *l2_sim_result)

{
  Instruction *pIVar1;
  Instruction *insn;
  anon_class_24_3_72e690ea predicate;
  anon_class_24_3_72e690ea predicate_00;
  anon_class_24_3_72e690ea predicate_01;
  anon_class_24_3_72e690ea predicate_02;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
  __first;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
  __first_00;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
  __last;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
  __last_00;
  size_type sVar2;
  _Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> _Var3;
  _Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> _Var4;
  _Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> _Var5;
  _Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> _Var6;
  _Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> _Var7;
  _Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> _Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  RegionRegisterLiveness *pRVar13;
  CFG *this_00;
  BasicBlock *pBVar14;
  Loop *pLVar15;
  Loop *extraout_RAX;
  anon_class_8_1_5b1a6210_for_predicate_ aVar16;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *extraout_RAX_00;
  size_type sVar17;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *puVar18;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *end;
  difference_type __n;
  __node_base *p_Var19;
  size_t sVar20;
  size_t sVar21;
  anon_class_8_1_5b1a6210_for_predicate_ predicate_03;
  __node_base *p_Var22;
  __node_base _Var23;
  __node_base *p_Var24;
  Instruction *pIVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  __hashtable *__h_2;
  __hashtable *__h;
  size_t l2_reg_count;
  size_t l1_reg_count;
  anon_class_24_3_72e690ea belong_to_loop1;
  int local_178;
  int iStack_174;
  Op OStack_170;
  int iStack_16c;
  __node_gen_type __node_gen;
  Op OStack_150;
  int iStack_14c;
  undefined1 local_130 [16];
  _Any_data local_118;
  pointer local_108;
  code *local_100;
  RegionRegisterLiveness *local_f8;
  anon_class_8_1_5b1a6210_for_predicate_ belong_to_loop2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  exit_blocks;
  Range l2_block_live_out;
  Range live_loop;
  
  puVar18 = copied_inst;
  predicate_03.moved_inst = &l1_sim_result->live_in_;
  RegionRegisterLiveness::Clear(l1_sim_result);
  RegionRegisterLiveness::Clear(l2_sim_result);
  belong_to_loop1.moved_inst = moved_inst;
  belong_to_loop1.copied_inst = copied_inst;
  belong_to_loop1.loop = loop;
  belong_to_loop2.moved_inst = moved_inst;
  pRVar13 = Get(this,loop->loop_header_);
  exit_blocks._M_h._M_buckets = &((pRVar13->live_in_)._M_h._M_before_begin._M_nxt)->_M_nxt;
  __node_gen._M_h = (__hashtable_alloc *)0x0;
  predicate.copied_inst = belong_to_loop1.copied_inst;
  predicate.moved_inst = belong_to_loop1.moved_inst;
  predicate.loop = belong_to_loop1.loop;
  MakeFilterIteratorRange<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
            (&live_loop,(opt *)&exit_blocks,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)&__node_gen,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)puVar18,predicate);
  _Var7 = live_loop.end_.end_;
  _Var6 = live_loop.end_.cur_;
  exit_blocks._M_h._M_rehash_policy._0_8_ = live_loop.begin_.predicate_.loop;
  exit_blocks._M_h._M_buckets =
       (__buckets_ptr)
       live_loop.begin_.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  exit_blocks._M_h._M_bucket_count =
       (size_type)
       live_loop.begin_.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __node_gen._M_h = (__hashtable_alloc *)l1_sim_result;
  while (((_Node_iterator_base<spvtools::opt::Instruction_*,_false>)exit_blocks._M_h._M_buckets !=
          _Var6.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur ||
         ((_Node_iterator_base<spvtools::opt::Instruction_*,_false>)exit_blocks._M_h._M_bucket_count
          != _Var7.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur))) {
    std::
    _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
              ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)l1_sim_result,exit_blocks._M_h._M_buckets + 1,&__node_gen);
    FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
    ::MoveToNextPosition
              ((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
                *)&exit_blocks);
  }
  exit_blocks._M_h._M_buckets = &((pRVar13->live_in_)._M_h._M_before_begin._M_nxt)->_M_nxt;
  __node_gen._M_h = (__hashtable_alloc *)0x0;
  end = moved_inst;
  MakeFilterIteratorRange<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__1>
            ((Range *)&live_loop,(opt *)&exit_blocks,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)&__node_gen,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)moved_inst,
             predicate_03);
  pLVar15 = live_loop.begin_.predicate_.loop;
  puVar18 = live_loop.begin_.predicate_.copied_inst;
  exit_blocks._M_h._M_buckets =
       (__buckets_ptr)
       live_loop.begin_.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  exit_blocks._M_h._M_bucket_count =
       (size_type)
       live_loop.begin_.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __node_gen._M_h = (__hashtable_alloc *)l2_sim_result;
  while (((unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
           *)exit_blocks._M_h._M_buckets != puVar18 ||
         ((Loop *)exit_blocks._M_h._M_bucket_count != pLVar15))) {
    std::
    _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
              ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)l2_sim_result,exit_blocks._M_h._M_buckets + 1,&__node_gen);
    FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:459:26)>
    ::MoveToNextPosition
              ((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>
                *)&exit_blocks);
  }
  exit_blocks._M_h._M_buckets = &exit_blocks._M_h._M_single_bucket;
  exit_blocks._M_h._M_bucket_count = 1;
  exit_blocks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  exit_blocks._M_h._M_element_count = 0;
  exit_blocks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  exit_blocks._M_h._M_rehash_policy._M_next_resize = 0;
  exit_blocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Loop::GetExitBlocks(loop,&exit_blocks);
  for (_Var23._M_nxt = exit_blocks._M_h._M_before_begin._M_nxt;
      _Var23._M_nxt != (_Hash_node_base *)0x0; _Var23._M_nxt = (_Var23._M_nxt)->_M_nxt) {
    pRVar13 = Get(this,*(uint32_t *)&_Var23._M_nxt[1]._M_nxt);
    std::__detail::
    _Insert_base<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::insert<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>>
              ((_Insert_base<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&l2_sim_result->live_out_,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>)
               (pRVar13->live_in_)._M_h._M_before_begin._M_nxt,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>)0x0);
  }
  __node_gen._M_h = (__hashtable_alloc *)(l2_sim_result->live_out_)._M_h._M_before_begin._M_nxt;
  l2_block_live_out.begin_.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>.
  _M_cur = (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)(__node_type *)0x0;
  predicate_00.copied_inst = belong_to_loop1.copied_inst;
  predicate_00.moved_inst = belong_to_loop1.moved_inst;
  predicate_00.loop = belong_to_loop1.loop;
  MakeFilterIteratorRange<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
            ((Range *)&live_loop,(opt *)&__node_gen,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)&l2_block_live_out,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)end,predicate_00);
  __first.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       live_loop.begin_.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __first.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       live_loop.begin_.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __first.predicate_.moved_inst = live_loop.begin_.predicate_.moved_inst;
  __first.predicate_.copied_inst = live_loop.begin_.predicate_.copied_inst;
  __first.predicate_.loop = live_loop.begin_.predicate_.loop;
  __last.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       live_loop.end_.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __last.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       live_loop.end_.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __last.predicate_.moved_inst = live_loop.end_.predicate_.moved_inst;
  __last.predicate_.copied_inst = live_loop.end_.predicate_.copied_inst;
  __last.predicate_.loop = live_loop.end_.predicate_.loop;
  std::
  unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
  ::
  insert<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>>
            ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
              *)&l1_sim_result->live_out_,__first,__last);
  p_Var22 = &(l2_sim_result->live_in_)._M_h._M_before_begin;
  __node_gen._M_h = (__hashtable_alloc *)(l2_sim_result->live_in_)._M_h._M_before_begin._M_nxt;
  l2_block_live_out.begin_.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>.
  _M_cur = (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)(__node_type *)0x0;
  predicate_01.copied_inst = belong_to_loop1.copied_inst;
  predicate_01.moved_inst = belong_to_loop1.moved_inst;
  predicate_01.loop = belong_to_loop1.loop;
  MakeFilterIteratorRange<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
            ((Range *)&live_loop,(opt *)&__node_gen,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)&l2_block_live_out,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)end,predicate_01);
  __first_00.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       live_loop.begin_.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __first_00.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       live_loop.begin_.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __first_00.predicate_.moved_inst = live_loop.begin_.predicate_.moved_inst;
  __first_00.predicate_.copied_inst = live_loop.begin_.predicate_.copied_inst;
  __first_00.predicate_.loop = live_loop.begin_.predicate_.loop;
  __last_00.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       live_loop.end_.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __last_00.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       live_loop.end_.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  __last_00.predicate_.moved_inst = live_loop.end_.predicate_.moved_inst;
  __last_00.predicate_.copied_inst = live_loop.end_.predicate_.copied_inst;
  __last_00.predicate_.loop = live_loop.end_.predicate_.loop;
  std::
  unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
  ::
  insert<spvtools::opt::FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>>
            ((unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>
              *)&l1_sim_result->live_out_,__first_00,__last_00);
  std::__detail::
  _Insert_base<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::insert<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>>
            ((_Insert_base<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)l2_sim_result,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false>)
             (l1_sim_result->live_out_)._M_h._M_before_begin._M_nxt,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false>)0x0);
  p_Var19 = &(l1_sim_result->live_in_)._M_h._M_before_begin;
  while (p_Var19 = p_Var19->_M_nxt, p_Var19 != (__node_base *)0x0) {
    RegionRegisterLiveness::AddRegisterClass(l1_sim_result,(Instruction *)p_Var19[1]._M_nxt);
  }
  while (p_Var22 = p_Var22->_M_nxt, p_Var22 != (__node_base *)0x0) {
    RegionRegisterLiveness::AddRegisterClass(l2_sim_result,(Instruction *)p_Var22[1]._M_nxt);
  }
  l1_sim_result->used_registers_ = 0;
  l2_sim_result->used_registers_ = 0;
  p_Var24 = &(loop->loop_basic_blocks_)._M_h._M_before_begin;
  while( true ) {
    p_Var24 = p_Var24->_M_nxt;
    if (p_Var24 == (__node_base *)0x0) {
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&exit_blocks._M_h);
      return;
    }
    sVar2 = *(size_type *)(p_Var24 + 1);
    this_00 = IRContext::cfg(this->context_);
    pBVar14 = CFG::block(this_00,(uint32_t)sVar2);
    pRVar13 = Get(this,(uint32_t)sVar2);
    if (pRVar13 == (RegionRegisterLiveness *)0x0) break;
    __node_gen._M_h = (__hashtable_alloc *)(pRVar13->live_out_)._M_h._M_before_begin._M_nxt;
    l2_block_live_out.begin_.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>.
    _M_cur = (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)(__node_type *)0x0;
    predicate_02.copied_inst = belong_to_loop1.copied_inst;
    predicate_02.moved_inst = belong_to_loop1.moved_inst;
    predicate_02.loop = belong_to_loop1.loop;
    MakeFilterIteratorRange<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
              (&live_loop,(opt *)&__node_gen,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)&l2_block_live_out
               ,(_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)end,predicate_02)
    ;
    __node_gen._M_h = (__hashtable_alloc *)(pRVar13->live_out_)._M_h._M_before_begin._M_nxt;
    local_118._M_unused._M_object = (Instruction *)0x0;
    end = moved_inst;
    MakeFilterIteratorRange<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__1>
              (&l2_block_live_out,(opt *)&__node_gen,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_118,
               (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)moved_inst,
               predicate_03);
    _Var8 = live_loop.end_.end_;
    _Var7 = live_loop.end_.cur_;
    _Var6 = live_loop.begin_.end_;
    __node_gen._M_h =
         (__hashtable_alloc *)
         live_loop.begin_.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur
    ;
    sVar20 = 0;
    pLVar15 = live_loop.begin_.predicate_.loop;
    while( true ) {
      _Var5.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           l2_block_live_out.end_.end_.
           super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      _Var4.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           l2_block_live_out.end_.cur_.
           super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      _Var3.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           l2_block_live_out.begin_.end_.
           super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      OStack_150 = (Op)_Var6.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      iStack_14c = _Var6.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur._4_4_
      ;
      local_178 = (int)_Var7.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      iStack_174 = _Var7.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur._4_4_
      ;
      OStack_170 = (Op)_Var8.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      iStack_16c = _Var8.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur._4_4_
      ;
      auVar26._0_4_ = -(uint)((int)__node_gen._M_h == local_178);
      auVar26._4_4_ = -(uint)(__node_gen._M_h._4_4_ == iStack_174);
      auVar26._8_4_ = -(uint)(OStack_150 == OStack_170);
      auVar26._12_4_ = -(uint)(iStack_14c == iStack_16c);
      auVar28._4_4_ = auVar26._0_4_;
      auVar28._0_4_ = auVar26._4_4_;
      auVar28._8_4_ = auVar26._12_4_;
      auVar28._12_4_ = auVar26._8_4_;
      iVar12 = movmskpd((int)pLVar15,auVar28 & auVar26);
      if (iVar12 == 3) break;
      FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
      ::MoveToNextPosition
                ((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
                  *)&__node_gen);
      sVar20 = sVar20 + 1;
      pLVar15 = extraout_RAX;
    }
    __node_gen._M_h =
         (__hashtable_alloc *)
         l2_block_live_out.begin_.cur_.
         super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
    sVar21 = 0;
    aVar16.moved_inst = l2_block_live_out.begin_.predicate_.moved_inst;
    l1_reg_count = sVar20;
    while( true ) {
      OStack_150 = (Op)_Var3.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      iStack_14c = _Var3.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur._4_4_
      ;
      local_178 = (int)_Var4.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      iStack_174 = _Var4.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur._4_4_
      ;
      OStack_170 = (Op)_Var5.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
      iStack_16c = _Var5.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur._4_4_
      ;
      auVar27._0_4_ = -(uint)((int)__node_gen._M_h == local_178);
      auVar27._4_4_ = -(uint)(__node_gen._M_h._4_4_ == iStack_174);
      auVar27._8_4_ = -(uint)(OStack_150 == OStack_170);
      auVar27._12_4_ = -(uint)(iStack_14c == iStack_16c);
      auVar29._4_4_ = auVar27._0_4_;
      auVar29._0_4_ = auVar27._4_4_;
      auVar29._8_4_ = auVar27._12_4_;
      auVar29._12_4_ = auVar27._8_4_;
      iVar12 = movmskpd((int)aVar16.moved_inst,auVar29 & auVar27);
      if (iVar12 == 3) break;
      FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:459:26)>
      ::MoveToNextPosition
                ((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>
                  *)&__node_gen);
      sVar21 = sVar21 + 1;
      aVar16.moved_inst = extraout_RAX_00;
    }
    __node_gen._M_h = (__hashtable_alloc *)(local_130 + 8);
    local_130 = (undefined1  [16])0x0;
    pIVar25 = &(pBVar14->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    pIVar1 = (pBVar14->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    l2_reg_count = sVar21;
    local_f8 = pRVar13;
    while ((pIVar25 != pIVar1 &&
           (insn = (pIVar25->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_,
           insn->opcode_ != OpPhi))) {
      bVar9 = SimulateFission::anon_class_24_3_72e690ea::operator()(&belong_to_loop1,insn);
      bVar10 = FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:459:26)>
               ::anon_class_8_1_5b1a6210_for_predicate_::operator()(&belong_to_loop2,insn);
      local_118._8_8_ = 0;
      local_118._M_unused._M_object = ::operator_new(0x30);
      (((Instruction *)local_118._M_unused._0_8_)->
      super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase =
           (_func_int **)local_f8;
      (((Instruction *)local_118._M_unused._0_8_)->
      super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = (Instruction *)&__node_gen;
      (((Instruction *)local_118._M_unused._0_8_)->
      super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (Instruction *)&l1_reg_count;
      *(size_t **)
       &(((Instruction *)local_118._M_unused._0_8_)->
        super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ = &l2_reg_count;
      *(bool *)&((Instruction *)local_118._M_unused._0_8_)->context_ = bVar9;
      *(bool *)((long)&((Instruction *)local_118._M_unused._0_8_)->context_ + 1) = bVar10;
      *(RegisterLiveness **)&((Instruction *)local_118._M_unused._0_8_)->opcode_ = this;
      local_100 = std::
                  _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:540:24)>
                  ::_M_invoke;
      local_108 = (pointer)std::
                           _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:540:24)>
                           ::_M_manager;
      Instruction::ForEachInId(insn,(function<void_(unsigned_int_*)> *)&local_118);
      if (local_108 != (pointer)0x0) {
        (*(code *)local_108)(&local_118,&local_118,3);
      }
      sVar20 = l1_reg_count;
      if (l1_reg_count < l1_sim_result->used_registers_) {
        sVar20 = l1_sim_result->used_registers_;
      }
      l1_sim_result->used_registers_ = sVar20;
      end = (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
             *)l2_reg_count;
      if (l2_reg_count <
          (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
           *)l2_sim_result->used_registers_) {
        end = (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
               *)l2_sim_result->used_registers_;
      }
      l2_sim_result->used_registers_ = (size_t)end;
      bVar11 = anon_unknown_8::CreatesRegisterUsage(insn);
      if (bVar11) {
        if (bVar9) {
          local_118._M_unused._0_8_ = (undefined8)insn;
          sVar17 = std::
                   _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count((_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)l1_sim_result,(key_type *)&local_118);
          if (sVar17 == 0) {
            RegionRegisterLiveness::AddRegisterClass(l1_sim_result,insn);
          }
          l1_reg_count = l1_reg_count - 1;
        }
        if (bVar10) {
          local_118._M_unused._0_8_ = (undefined8)insn;
          sVar17 = std::
                   _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count((_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                            *)l2_sim_result,(key_type *)&local_118);
          if (sVar17 == 0) {
            RegionRegisterLiveness::AddRegisterClass(l2_sim_result,insn);
          }
          l2_reg_count = l2_reg_count - 1;
        }
      }
      pIVar25 = (pIVar25->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
    }
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&__node_gen);
  }
  __assert_fail("live_inout != nullptr && \"Basic block not processed\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp"
                ,0x207,
                "void spvtools::opt::RegisterLiveness::SimulateFission(const Loop &, const std::unordered_set<Instruction *> &, const std::unordered_set<Instruction *> &, RegionRegisterLiveness *, RegionRegisterLiveness *) const"
               );
}

Assistant:

void RegisterLiveness::SimulateFission(
    const Loop& loop, const std::unordered_set<Instruction*>& moved_inst,
    const std::unordered_set<Instruction*>& copied_inst,
    RegionRegisterLiveness* l1_sim_result,
    RegionRegisterLiveness* l2_sim_result) const {
  l1_sim_result->Clear();
  l2_sim_result->Clear();

  // Filter predicates: consider instructions that only belong to the first and
  // second loop.
  auto belong_to_loop1 = [&moved_inst, &copied_inst, &loop](Instruction* insn) {
    return moved_inst.count(insn) || copied_inst.count(insn) ||
           !loop.IsInsideLoop(insn);
  };
  auto belong_to_loop2 = [&moved_inst](Instruction* insn) {
    return !moved_inst.count(insn);
  };

  const RegionRegisterLiveness* header_live_inout = Get(loop.GetHeaderBlock());
  // l1 live-in
  {
    auto live_loop = MakeFilterIteratorRange(
        header_live_inout->live_in_.begin(), header_live_inout->live_in_.end(),
        belong_to_loop1);
    l1_sim_result->live_in_.insert(live_loop.begin(), live_loop.end());
  }
  // l2 live-in
  {
    auto live_loop = MakeFilterIteratorRange(
        header_live_inout->live_in_.begin(), header_live_inout->live_in_.end(),
        belong_to_loop2);
    l2_sim_result->live_in_.insert(live_loop.begin(), live_loop.end());
  }

  std::unordered_set<uint32_t> exit_blocks;
  loop.GetExitBlocks(&exit_blocks);

  // l2 live-out.
  for (uint32_t bb_id : exit_blocks) {
    const RegionRegisterLiveness* live_inout = Get(bb_id);
    l2_sim_result->live_out_.insert(live_inout->live_in_.begin(),
                                    live_inout->live_in_.end());
  }
  // l1 live-out.
  {
    auto live_out = MakeFilterIteratorRange(l2_sim_result->live_out_.begin(),
                                            l2_sim_result->live_out_.end(),
                                            belong_to_loop1);
    l1_sim_result->live_out_.insert(live_out.begin(), live_out.end());
  }
  {
    auto live_out =
        MakeFilterIteratorRange(l2_sim_result->live_in_.begin(),
                                l2_sim_result->live_in_.end(), belong_to_loop1);
    l1_sim_result->live_out_.insert(live_out.begin(), live_out.end());
  }
  // Lives out of l1 are live out of l2 so are live in of l2 as well.
  l2_sim_result->live_in_.insert(l1_sim_result->live_out_.begin(),
                                 l1_sim_result->live_out_.end());

  for (Instruction* insn : l1_sim_result->live_in_) {
    l1_sim_result->AddRegisterClass(insn);
  }
  for (Instruction* insn : l2_sim_result->live_in_) {
    l2_sim_result->AddRegisterClass(insn);
  }

  l1_sim_result->used_registers_ = 0;
  l2_sim_result->used_registers_ = 0;

  for (uint32_t bb_id : loop.GetBlocks()) {
    BasicBlock* bb = context_->cfg()->block(bb_id);

    const RegisterLiveness::RegionRegisterLiveness* live_inout = Get(bb_id);
    assert(live_inout != nullptr && "Basic block not processed");
    auto l1_block_live_out =
        MakeFilterIteratorRange(live_inout->live_out_.begin(),
                                live_inout->live_out_.end(), belong_to_loop1);
    auto l2_block_live_out =
        MakeFilterIteratorRange(live_inout->live_out_.begin(),
                                live_inout->live_out_.end(), belong_to_loop2);

    size_t l1_reg_count =
        std::distance(l1_block_live_out.begin(), l1_block_live_out.end());
    size_t l2_reg_count =
        std::distance(l2_block_live_out.begin(), l2_block_live_out.end());

    std::unordered_set<uint32_t> die_in_block;
    for (Instruction& insn : make_range(bb->rbegin(), bb->rend())) {
      if (insn.opcode() == spv::Op::OpPhi) {
        break;
      }

      bool does_belong_to_loop1 = belong_to_loop1(&insn);
      bool does_belong_to_loop2 = belong_to_loop2(&insn);
      insn.ForEachInId([live_inout, &die_in_block, &l1_reg_count, &l2_reg_count,
                        does_belong_to_loop1, does_belong_to_loop2,
                        this](uint32_t* id) {
        Instruction* op_insn = context_->get_def_use_mgr()->GetDef(*id);
        if (!CreatesRegisterUsage(op_insn) ||
            live_inout->live_out_.count(op_insn)) {
          // already taken into account.
          return;
        }
        if (!die_in_block.count(*id)) {
          if (does_belong_to_loop1) {
            l1_reg_count++;
          }
          if (does_belong_to_loop2) {
            l2_reg_count++;
          }
          die_in_block.insert(*id);
        }
      });
      l1_sim_result->used_registers_ =
          std::max(l1_sim_result->used_registers_, l1_reg_count);
      l2_sim_result->used_registers_ =
          std::max(l2_sim_result->used_registers_, l2_reg_count);
      if (CreatesRegisterUsage(&insn)) {
        if (does_belong_to_loop1) {
          if (!l1_sim_result->live_in_.count(&insn)) {
            l1_sim_result->AddRegisterClass(&insn);
          }
          l1_reg_count--;
        }
        if (does_belong_to_loop2) {
          if (!l2_sim_result->live_in_.count(&insn)) {
            l2_sim_result->AddRegisterClass(&insn);
          }
          l2_reg_count--;
        }
      }
    }
  }
}